

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O3

vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_> *
tinyusdz::tydra::GetGeomSubsets
          (vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
           *__return_storage_ptr__,Stage *stage,Path *prim_path,token *familyName,
          bool prim_must_be_geommesh)

{
  pointer *pppGVar1;
  byte bVar2;
  vtable_type *pvVar3;
  pointer pPVar4;
  long lVar5;
  size_t __n;
  bool bVar6;
  uint32_t uVar7;
  int iVar8;
  pointer pPVar9;
  iterator __position;
  GeomSubset *pv;
  Prim *pprim;
  GeomSubset *local_68;
  byte local_60;
  long *local_58;
  size_t local_50;
  long local_48 [2];
  Prim *local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38 = (Prim *)0x0;
  bVar6 = Stage::find_prim_at_path(stage,prim_path,&local_38,(string *)0x0);
  if (((bVar6) && (local_38 != (Prim *)0x0)) &&
     ((!prim_must_be_geommesh ||
      ((pvVar3 = (local_38->_data).v_.vtable, pvVar3 != (vtable_type *)0x0 &&
       (uVar7 = (*pvVar3->type_id)(), uVar7 == 0x405)))))) {
    pPVar9 = (local_38->_children).
             super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
             super__Vector_impl_data._M_start;
    pPVar4 = (local_38->_children).
             super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pPVar9 != pPVar4) {
      do {
        local_68 = tinyusdz::value::Value::as<tinyusdz::GeomSubset>(&pPVar9->_data,false);
        if (local_68 != (GeomSubset *)0x0) {
          if ((familyName->str_)._M_string_length == 0) {
LAB_004d47da:
            __position._M_current =
                 (__return_storage_ptr__->
                 super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (__return_storage_ptr__->
                super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage) {
LAB_004d47ee:
              ::std::vector<tinyusdz::GeomSubset_const*,std::allocator<tinyusdz::GeomSubset_const*>>
              ::_M_realloc_insert<tinyusdz::GeomSubset_const*const&>
                        ((vector<tinyusdz::GeomSubset_const*,std::allocator<tinyusdz::GeomSubset_const*>>
                          *)__return_storage_ptr__,__position,&local_68);
            }
            else {
LAB_004d47e4:
              *__position._M_current = local_68;
              pppGVar1 = &(__return_storage_ptr__->
                          super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
                          )._M_impl.super__Vector_impl_data._M_finish;
              *pppGVar1 = *pppGVar1 + 1;
            }
          }
          else {
            bVar2 = (local_68->familyName)._attrib.has_value_;
            if ((bool)bVar2 == false) {
              if ((((local_68->familyName)._paths.
                    super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    (local_68->familyName)._paths.
                    super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                    super__Vector_impl_data._M_start) &&
                  ((local_68->familyName)._value_empty == false)) &&
                 ((local_68->familyName)._blocked != true)) goto LAB_004d47da;
            }
            else {
              lVar5 = *(long *)&(local_68->familyName)._attrib.contained;
              local_60 = bVar2;
              local_58 = local_48;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_58,lVar5,
                         *(long *)((long)&(local_68->familyName)._attrib.contained + 8) + lVar5);
              bVar2 = local_60;
            }
            local_60 = bVar2;
            if ((local_60 & 1) != 0) {
              if (local_58 != local_48) {
                operator_delete(local_58,local_48[0] + 1);
              }
              local_60 = (local_68->familyName)._attrib.has_value_;
              if ((bool)local_60 == true) {
                lVar5 = *(long *)&(local_68->familyName)._attrib.contained;
                local_58 = local_48;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_58,lVar5,
                           *(long *)((long)&(local_68->familyName)._attrib.contained + 8) + lVar5);
              }
              if ((local_60 & 1) == 0) {
                __assert_fail("has_value()",
                              "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                              ,0x584,
                              "const value_type &nonstd::optional_lite::optional<tinyusdz::Token>::value() const [T = tinyusdz::Token]"
                             );
              }
              if (local_58 != local_48) {
                operator_delete(local_58,local_48[0] + 1);
              }
              __n = (familyName->str_)._M_string_length;
              if ((__n == local_50) &&
                 ((__n == 0 ||
                  (iVar8 = bcmp((familyName->str_)._M_dataplus._M_p,local_58,__n), iVar8 == 0)))) {
                __position._M_current =
                     (__return_storage_ptr__->
                     super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
                if (__position._M_current ==
                    (__return_storage_ptr__->
                    super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
                    )._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_004d47ee;
                goto LAB_004d47e4;
              }
            }
          }
        }
        pPVar9 = pPVar9 + 1;
      } while (pPVar9 != pPVar4);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<const GeomSubset *> GetGeomSubsets(
    const tinyusdz::Stage &stage, const tinyusdz::Path &prim_path,
    const tinyusdz::value::token &familyName, bool prim_must_be_geommesh) {
  std::vector<const GeomSubset *> result;

  const Prim *pprim{nullptr};
  if (!stage.find_prim_at_path(prim_path, pprim)) {
    return result;
  }

  if (!pprim) {
    return result;
  }

  if (prim_must_be_geommesh && !pprim->is<GeomMesh>()) {
    return result;
  }

  // Only account for child Prims.
  for (const auto &p : pprim->children()) {
    if (auto pv = p.as<GeomSubset>()) {
      if (familyName.valid()) {
        if (pv->familyName.authored()) {
          if (pv->familyName.get_value().has_value()) {
            const value::token &tok = pv->familyName.get_value().value();
            if (familyName.str() == tok.str()) {
              result.push_back(pv);
            }
          } else {
            // connection attr or value block?
            // skip adding this GeomSubset.
          }
        } else {
          result.push_back(pv);
        }
      } else {
        result.push_back(pv);
      }
    }
  }

  return result;
}